

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

MainFunc __thiscall capnp::compiler::CompilerMain::getConvertMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  MainFunc MVar4;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr title;
  StringPtr title_00;
  StringPtr title_01;
  StringPtr version;
  StringPtr briefDescription;
  StringPtr helpText_00;
  StringPtr argumentTitle;
  StringPtr helpText_01;
  MainBuilder builder;
  Function<kj::MainBuilder::Validity_()> local_e8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_d8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_c8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_b8;
  Function<kj::MainBuilder::Validity_()> local_a8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_98;
  Function<kj::MainBuilder::Validity_()> local_88;
  MainBuilder local_78;
  OptionName local_68;
  char *local_58;
  undefined8 uStack_50;
  OptionName local_48;
  OptionName local_38;
  char *local_28;
  undefined8 uStack_20;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_28 = "";
  uStack_20 = 1;
  extendedDescription.content.size_ = 1;
  extendedDescription.content.ptr = "";
  version.content.size_ = 0x1c;
  version.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription.content.size_ = 0x2eb;
  briefDescription.content.ptr =
       "Converts messages between formats. Reads a stream of messages from stdin in format <from> and writes them to stdout in format <to>. Valid formats are:\n    binary      standard binary format\n    packed      packed binary format (deflates zeroes)\n    flat        binary single segment, no segment table (rare)\n    flat-packed flat and packed\n    canonical   canonicalized binary single segment, no segment table\n    text        schema language struct literal format\n    json        JSON format\nWhen using \"text\" or \"json\" format, you must specify <schema-file> and <type> (but they are ignored and can be omitted for binary-to-binary conversions). <type> names names a struct type defined in <schema-file>, which is the root type of the message(s)."
  ;
  kj::MainBuilder::MainBuilder
            (&local_78,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&local_78);
  local_38.isLong = true;
  local_38.field_1.longName = "short";
  local_88.impl.ptr = (Iface *)operator_new(0x18);
  (local_88.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a768;
  local_88.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_88.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  names._M_len = 1;
  names._M_array = &local_38;
  helpText_00.content.size_ = 0x93;
  helpText_00.content.ptr =
       "Write text or JSON output in short (non-pretty) format. Each message will be printed on one line, without using whitespace to improve readability."
  ;
  pMVar3 = kj::MainBuilder::addOption(&local_78,names,&local_88,helpText_00);
  local_48.isLong = true;
  local_48.field_1.longName = "segment-size";
  local_98.impl.ptr = (Iface *)operator_new(0x18);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a7d0;
  local_98.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_98.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  local_58 = 
  "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  uStack_50 = 0xe4;
  helpText.content.size_ = 0xe4;
  helpText.content.ptr =
       "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  names_00._M_len = 1;
  names_00._M_array = &local_48;
  argumentTitle.content.size_ = 4;
  argumentTitle.content.ptr = "<n>";
  pMVar3 = kj::MainBuilder::addOptionWithArg(pMVar3,names_00,&local_98,argumentTitle,helpText);
  local_68.isLong = true;
  local_68.field_1.longName = "quiet";
  local_a8.impl.ptr = (Iface *)operator_new(0x18);
  (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a838;
  local_a8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_a8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  names_01._M_len = 1;
  names_01._M_array = &local_68;
  helpText_01.content.size_ = 0xa5;
  helpText_01.content.ptr =
       "Do not print warning messages about the input being in the wrong format.  Use this if you find the warnings are wrong (but also let us know so we can improve them)."
  ;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_01,&local_a8,helpText_01);
  local_b8.impl.ptr = (Iface *)operator_new(0x18);
  (local_b8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a8a0;
  local_b8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_b8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#8}>>>
        ::instance;
  title.content.size_ = 0xc;
  title.content.ptr = "<from>:<to>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title,&local_b8);
  local_c8.impl.ptr = (Iface *)operator_new(0x18);
  (local_c8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a908;
  local_c8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_c8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#9},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#10}>>>
        ::instance;
  title_00.content.size_ = 0xe;
  title_00.content.ptr = "<schema-file>";
  pMVar3 = kj::MainBuilder::expectOptionalArg(pMVar3,title_00,&local_c8);
  local_d8.impl.ptr = (Iface *)operator_new(0x18);
  (local_d8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027a970;
  local_d8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_d8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#11},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#12}>>>
        ::instance;
  title_01.content.size_ = 7;
  title_01.content.ptr = "<type>";
  pMVar3 = kj::MainBuilder::expectOptionalArg(pMVar3,title_01,&local_d8);
  local_e8.impl.ptr = (Iface *)operator_new(0x18);
  (local_e8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0027aa18;
  local_e8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_e8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#13},capnp::compiler::CompilerMain::getConvertMain()::{lambda(auto:1&,(auto:2&&)...)#14}>>>
        ::instance;
  kj::MainBuilder::callAfterParsing(pMVar3,&local_e8);
  pIVar1 = local_e8.impl.ptr;
  if (local_e8.impl.ptr != (Iface *)0x0) {
    local_e8.impl.ptr = (Iface *)0x0;
    (**(local_e8.impl.disposer)->_vptr_Disposer)
              (local_e8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_d8.impl.ptr;
  if (local_d8.impl.ptr != (Iface *)0x0) {
    local_d8.impl.ptr = (Iface *)0x0;
    (**(local_d8.impl.disposer)->_vptr_Disposer)
              (local_d8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_c8.impl.ptr;
  if (local_c8.impl.ptr != (Iface *)0x0) {
    local_c8.impl.ptr = (Iface *)0x0;
    (**(local_c8.impl.disposer)->_vptr_Disposer)
              (local_c8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_b8.impl.ptr;
  if (local_b8.impl.ptr != (Iface *)0x0) {
    local_b8.impl.ptr = (Iface *)0x0;
    (**(local_b8.impl.disposer)->_vptr_Disposer)
              (local_b8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar1 = local_a8.impl.ptr;
  if (local_a8.impl.ptr != (Iface *)0x0) {
    local_a8.impl.ptr = (Iface *)0x0;
    (**(local_a8.impl.disposer)->_vptr_Disposer)
              (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar1 = local_88.impl.ptr;
  if (local_88.impl.ptr != (Iface *)0x0) {
    local_88.impl.ptr = (Iface *)0x0;
    (**(local_88.impl.disposer)->_vptr_Disposer)
              (local_88.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&local_78);
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

kj::MainFunc getConvertMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Converts messages between formats. Reads a stream of messages from stdin in format "
          "<from> and writes them to stdout in format <to>. Valid formats are:\n"
          "    binary      standard binary format\n"
          "    packed      packed binary format (deflates zeroes)\n"
          "    flat        binary single segment, no segment table (rare)\n"
          "    flat-packed flat and packed\n"
          "    canonical   canonicalized binary single segment, no segment table\n"
          "    text        schema language struct literal format\n"
          "    json        JSON format\n"
          "When using \"text\" or \"json\" format, you must specify <schema-file> and <type> "
          "(but they are ignored and can be omitted for binary-to-binary conversions). "
          "<type> names names a struct type defined in <schema-file>, which is the root type "
          "of the message(s).");
    addGlobalOptions(builder);
    builder.addOption({"short"}, KJ_BIND_METHOD(*this, printShort),
               "Write text or JSON output in short (non-pretty) format. Each message will "
               "be printed on one line, without using whitespace to improve readability.")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
               "For binary output, sets the preferred segment size on the MallocMessageBuilder to <n> "
               "words and turns off heuristic growth.  This flag is mainly useful "
               "for testing.  Without it, each message will be written as a single "
               "segment.")
           .addOption({"quiet"}, KJ_BIND_METHOD(*this, setQuiet),
               "Do not print warning messages about the input being in the wrong format.  "
               "Use this if you find the warnings are wrong (but also let us know so "
               "we can improve them).")
           .expectArg("<from>:<to>", KJ_BIND_METHOD(*this, setConversion))
           .expectOptionalArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectOptionalArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, convert));
    return builder.build();
  }